

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapOneofField
          (Reflection *this,Message *message1,Message *message2,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  OneofDescriptor *pOVar4;
  uint32 uVar5;
  uint uVar6;
  ulong uVar7;
  FieldDescriptor *field;
  double *pdVar8;
  uint *puVar9;
  unsigned_long *puVar10;
  int *piVar11;
  long *plVar12;
  float *pfVar13;
  bool *pbVar14;
  LogMessage *pLVar15;
  FieldDescriptor *field_00;
  Message *sub_message;
  long lVar16;
  string temp_string;
  undefined1 local_121;
  Message *local_120;
  FieldDescriptor *local_118;
  double local_110;
  int local_104;
  float local_100;
  uint local_fc;
  int local_f8;
  int local_f4;
  OneofDescriptor *local_f0;
  FieldDescriptor *local_e8;
  undefined1 local_e0 [56];
  double local_a8;
  unsigned_long local_a0;
  long local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  uVar7 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                     *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                        -0x55555554 + (this->schema_).oneof_case_offset_);
  local_f4 = *(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar7);
  iVar2 = *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar7);
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_f0 = oneof_descriptor;
  if (local_f4 == 0) {
    field = (FieldDescriptor *)0x0;
    local_120 = (Message *)0x0;
    goto LAB_0035c473;
  }
  field = Descriptor::FindFieldByNumber(this->descriptor_,local_f4);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_118 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,&local_118)
    ;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    piVar11 = GetRaw<int>(this,message1,field);
    local_f8 = *piVar11;
    local_120 = (Message *)0x0;
    break;
  case 2:
    plVar12 = GetRaw<long>(this,message1,field);
    local_98 = *plVar12;
    local_120 = (Message *)0x0;
    break;
  case 3:
    puVar9 = GetRaw<unsigned_int>(this,message1,field);
    local_fc = *puVar9;
    local_120 = (Message *)0x0;
    break;
  case 4:
    puVar10 = GetRaw<unsigned_long>(this,message1,field);
    local_a0 = *puVar10;
    local_120 = (Message *)0x0;
    break;
  case 5:
    pdVar8 = GetRaw<double>(this,message1,field);
    local_a8 = *pdVar8;
    goto LAB_0035c382;
  case 6:
    pfVar13 = GetRaw<float>(this,message1,field);
    local_100 = *pfVar13;
LAB_0035c382:
    local_120 = (Message *)0x0;
    break;
  case 7:
    pbVar14 = GetRaw<bool>(this,message1,field);
    local_121 = *pbVar14;
    local_120 = (Message *)0x0;
    break;
  case 8:
    piVar11 = GetRaw<int>(this,message1,field);
    local_104 = *piVar11;
    local_120 = (Message *)0x0;
    break;
  case 9:
    GetString_abi_cxx11_((string *)local_e0,this,message1,field);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_e0);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    goto LAB_0035c46a;
  case 10:
    local_120 = ReleaseMessage(this,message1,field,(MessageFactory *)0x0);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x212);
    pLVar15 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Unimplemented type: ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_118 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_e8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_118,
                 &local_e8);
    }
    pLVar15 = internal::LogMessage::operator<<
                        (pLVar15,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar15);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
LAB_0035c46a:
    local_120 = (Message *)0x0;
  }
LAB_0035c473:
  if (iVar2 == 0) {
    ClearOneof(this,message1,local_f0);
  }
  else {
    field_00 = Descriptor::FindFieldByNumber(this->descriptor_,iVar2);
    if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
      local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_118 = field_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,
                 &local_118);
    }
    switch(*(undefined4 *)
            (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4)) {
    case 1:
      piVar11 = GetRaw<int>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      iVar2 = *piVar11;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = iVar2;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 == 0) {
        if ((this->schema_).has_bits_offset_ != -1) {
          uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
LAB_0035ca5d:
          puVar9 = (uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                           (ulong)(uVar6 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_);
          *puVar9 = *puVar9 | 1 << ((byte)uVar6 & 0x1f);
        }
      }
      else {
LAB_0035c96b:
        *(undefined4 *)
         ((long)&(message1->super_MessageLite)._vptr_MessageLite +
         (ulong)(uint)((int)((ulong)(lVar16 - *(long *)(*(long *)(lVar16 + 0x10) + 0x30)) >> 4) *
                       -0x55555554 + (this->schema_).oneof_case_offset_)) =
             *(undefined4 *)(field_00 + 0x44);
      }
      break;
    case 2:
      plVar12 = GetRaw<long>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      lVar16 = *plVar12;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = lVar16;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 3:
      puVar9 = GetRaw<unsigned_int>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      uVar6 = *puVar9;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = uVar6;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 4:
      puVar10 = GetRaw<unsigned_long>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      uVar3 = *puVar10;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(unsigned_long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
           uVar3;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 5:
      pdVar8 = GetRaw<double>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      local_110 = *pdVar8;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(double *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_110
      ;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 6:
      pfVar13 = GetRaw<float>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      local_110 = (double)CONCAT44(local_110._4_4_,*pfVar13);
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
           local_110._0_4_;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 7:
      pbVar14 = GetRaw<bool>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      bVar1 = *pbVar14;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(bool *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = bVar1;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 8:
      piVar11 = GetRaw<int>(this,message2,field_00);
      pOVar4 = *(OneofDescriptor **)(field_00 + 0x58);
      if ((pOVar4 != (OneofDescriptor *)0x0) &&
         (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                             *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                                -0x55555554 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field_00 + 0x44))) {
        ClearOneof(this,message1,pOVar4);
      }
      iVar2 = *piVar11;
      uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
      *(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = iVar2;
      lVar16 = *(long *)(field_00 + 0x58);
      if (lVar16 != 0) goto LAB_0035c96b;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field_00);
        goto LAB_0035ca5d;
      }
      break;
    case 9:
      GetString_abi_cxx11_(&local_50,this,message2,field_00);
      SetString(this,message1,field_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      break;
    case 10:
      sub_message = ReleaseMessage(this,message2,field_00,(MessageFactory *)0x0);
      SetAllocatedMessage(this,message1,sub_message,field_00);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_e0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x231);
      pLVar15 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Unimplemented type: ");
      if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
        local_118 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_e8 = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_118,
                   &local_e8);
      }
      pLVar15 = internal::LogMessage::operator<<
                          (pLVar15,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                           (ulong)*(uint *)(field_00 + 0x38) * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar15);
      internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    }
  }
  if (local_f4 == 0) {
    ClearOneof(this,message2,local_f0);
    goto LAB_0035d032;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_118 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,&local_118)
    ;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_f8;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) {
LAB_0035cf0a:
      *(undefined4 *)
       ((long)&(message2->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar16 - *(long *)(*(long *)(lVar16 + 0x10) + 0x30)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x44);
      goto LAB_0035d032;
    }
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 2:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_98;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 3:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_fc;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 4:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(unsigned_long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
         local_a0;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 5:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(double *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_a8;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 6:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(float *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_100;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 7:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
         local_121;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 8:
    pOVar4 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar4 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar4 -
                                           *(long *)(*(long *)(pOVar4 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar4);
    }
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = local_104;
    lVar16 = *(long *)(field + 0x58);
    if (lVar16 != 0) goto LAB_0035cf0a;
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_0035d032;
    uVar6 = internal::ReflectionSchema::HasBitIndex(&this->schema_,field);
    break;
  case 9:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
    SetString(this,message2,field,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    goto LAB_0035d032;
  case 10:
    SetAllocatedMessage(this,message2,local_120,field);
    goto LAB_0035d032;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x251);
    pLVar15 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Unimplemented type: ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_118 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_e8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_118,
                 &local_e8);
    }
    pLVar15 = internal::LogMessage::operator<<
                        (pLVar15,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar15);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    goto LAB_0035d032;
  }
  puVar9 = (uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                   (ulong)(uVar6 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_);
  *puVar9 = *puVar9 | 1 << ((byte)uVar6 & 0x1f);
LAB_0035d032:
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* message1, Message* message2,
                                const OneofDescriptor* oneof_descriptor) const {
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = nullptr;
  std::string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = nullptr;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    // oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:           \
    temp_##TYPE = GetField<TYPE>(*message1, field1); \
    break;

      GET_TEMP_VALUE(INT32, int32);
      GET_TEMP_VALUE(INT64, int64);
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT, float);
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL, bool);
      GET_TEMP_VALUE(ENUM, int);
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 = descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
    SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
    break;

      SET_ONEOF_VALUE1(INT32, int32);
      SET_ONEOF_VALUE1(INT64, int64);
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT, float);
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL, bool);
      SET_ONEOF_VALUE1(ENUM, int);
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1, ReleaseMessage(message2, field2), field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)            \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    SetField<TYPE>(message2, field1, temp_##TYPE); \
    break;

      SET_ONEOF_VALUE2(INT32, int32);
      SET_ONEOF_VALUE2(INT64, int64);
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT, float);
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL, bool);
      SET_ONEOF_VALUE2(ENUM, int);
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}